

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpuck.h
# Opt level: O0

_Bool mp_decode_bool(char **data)

{
  uint8_t uVar1;
  uint8_t c;
  char **data_local;
  
  uVar1 = mp_load_u8(data);
  if (uVar1 == 0xc2) {
    data_local._7_1_ = false;
  }
  else {
    if (uVar1 != 0xc3) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/msgpuck.h"
                    ,0xaf5,"_Bool mp_decode_bool(const char **)");
    }
    data_local._7_1_ = true;
  }
  return data_local._7_1_;
}

Assistant:

MP_IMPL bool
mp_decode_bool(const char **data)
{
	uint8_t c = mp_load_u8(data);
	switch (c) {
	case 0xc3:
		return true;
	case 0xc2:
		return false;
	default:
		mp_unreachable();
	}
}